

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O3

bool __thiscall wabt::Opcode::IsEnabled(Opcode *this,Features *features)

{
  undefined1 uVar1;
  
  switch(this->enum_) {
  case Try:
  case Catch:
  case Throw:
  case Rethrow:
  case IfExcept:
    uVar1 = features->exceptions_enabled_;
    break;
  default:
    uVar1 = 1;
    break;
  case ReturnCall:
  case ReturnCallIndirect:
    uVar1 = features->tail_call_enabled_;
    break;
  case I32Extend8S:
  case I32Extend16S:
  case I64Extend8S:
  case I64Extend16S:
  case I64Extend32S:
    uVar1 = features->sign_extension_enabled_;
    break;
  case InterpAlloca:
  case InterpBrUnless:
  case InterpCallHost:
  case InterpData:
  case InterpDropKeep:
    uVar1 = 0;
    break;
  case I32TruncSSatF32:
  case I32TruncUSatF32:
  case I32TruncSSatF64:
  case I32TruncUSatF64:
  case I64TruncSSatF32:
  case I64TruncUSatF32:
  case I64TruncSSatF64:
  case I64TruncUSatF64:
    uVar1 = features->sat_float_to_int_enabled_;
    break;
  case MemoryInit:
  case MemoryDrop:
  case MemoryCopy:
  case MemoryFill:
  case TableInit:
  case TableDrop:
  case TableCopy:
    uVar1 = features->bulk_memory_enabled_;
    break;
  case V128Load:
  case V128Store:
  case V128Const:
  case V8X16Shuffle:
  case I8X16Splat:
  case I8X16ExtractLaneS:
  case I8X16ExtractLaneU:
  case I8X16ReplaceLane:
  case I16X8Splat:
  case I16X8ExtractLaneS:
  case I16X8ExtractLaneU:
  case I16X8ReplaceLane:
  case I32X4Splat:
  case I32X4ExtractLane:
  case I32X4ReplaceLane:
  case I64X2Splat:
  case I64X2ExtractLane:
  case I64X2ReplaceLane:
  case F32X4Splat:
  case F32X4ExtractLane:
  case F32X4ReplaceLane:
  case F64X2Splat:
  case F64X2ExtractLane:
  case F64X2ReplaceLane:
  case I8X16Eq:
  case I8X16Ne:
  case I8X16LtS:
  case I8X16LtU:
  case I8X16GtS:
  case I8X16GtU:
  case I8X16LeS:
  case I8X16LeU:
  case I8X16GeS:
  case I8X16GeU:
  case I16X8Eq:
  case I16X8Ne:
  case I16X8LtS:
  case I16X8LtU:
  case I16X8GtS:
  case I16X8GtU:
  case I16X8LeS:
  case I16X8LeU:
  case I16X8GeS:
  case I16X8GeU:
  case I32X4Eq:
  case I32X4Ne:
  case I32X4LtS:
  case I32X4LtU:
  case I32X4GtS:
  case I32X4GtU:
  case I32X4LeS:
  case I32X4LeU:
  case I32X4GeS:
  case I32X4GeU:
  case F32X4Eq:
  case F32X4Ne:
  case F32X4Lt:
  case F32X4Gt:
  case F32X4Le:
  case F32X4Ge:
  case F64X2Eq:
  case F64X2Ne:
  case F64X2Lt:
  case F64X2Gt:
  case F64X2Le:
  case F64X2Ge:
  case V128Not:
  case V128And:
  case V128Or:
  case V128Xor:
  case V128BitSelect:
  case I8X16Neg:
  case I8X16AnyTrue:
  case I8X16AllTrue:
  case I8X16Shl:
  case I8X16ShrS:
  case I8X16ShrU:
  case I8X16Add:
  case I8X16AddSaturateS:
  case I8X16AddSaturateU:
  case I8X16Sub:
  case I8X16SubSaturateS:
  case I8X16SubSaturateU:
  case I8X16Mul:
  case I16X8Neg:
  case I16X8AnyTrue:
  case I16X8AllTrue:
  case I16X8Shl:
  case I16X8ShrS:
  case I16X8ShrU:
  case I16X8Add:
  case I16X8AddSaturateS:
  case I16X8AddSaturateU:
  case I16X8Sub:
  case I16X8SubSaturateS:
  case I16X8SubSaturateU:
  case I16X8Mul:
  case I32X4Neg:
  case I32X4AnyTrue:
  case I32X4AllTrue:
  case I32X4Shl:
  case I32X4ShrS:
  case I32X4ShrU:
  case I32X4Add:
  case I32X4Sub:
  case I32X4Mul:
  case I64X2Neg:
  case I64X2AnyTrue:
  case I64X2AllTrue:
  case I64X2Shl:
  case I64X2ShrS:
  case I64X2ShrU:
  case I64X2Add:
  case I64X2Sub:
  case F32X4Abs:
  case F32X4Neg:
  case F32X4Sqrt:
  case F32X4Add:
  case F32X4Sub:
  case F32X4Mul:
  case F32X4Div:
  case F32X4Min:
  case F32X4Max:
  case F64X2Abs:
  case F64X2Neg:
  case F64X2Sqrt:
  case F64X2Add:
  case F64X2Sub:
  case F64X2Mul:
  case F64X2Div:
  case F64X2Min:
  case F64X2Max:
  case I32X4TruncSF32X4Sat:
  case I32X4TruncUF32X4Sat:
  case I64X2TruncSF64X2Sat:
  case I64X2TruncUF64X2Sat:
  case F32X4ConvertSI32X4:
  case F32X4ConvertUI32X4:
  case F64X2ConvertSI64X2:
  case F64X2ConvertUI64X2:
    uVar1 = features->simd_enabled_;
    break;
  case AtomicWake:
  case I32AtomicWait:
  case I64AtomicWait:
  case I32AtomicLoad:
  case I64AtomicLoad:
  case I32AtomicLoad8U:
  case I32AtomicLoad16U:
  case I64AtomicLoad8U:
  case I64AtomicLoad16U:
  case I64AtomicLoad32U:
  case I32AtomicStore:
  case I64AtomicStore:
  case I32AtomicStore8:
  case I32AtomicStore16:
  case I64AtomicStore8:
  case I64AtomicStore16:
  case I64AtomicStore32:
  case I32AtomicRmwAdd:
  case I64AtomicRmwAdd:
  case I32AtomicRmw8UAdd:
  case I32AtomicRmw16UAdd:
  case I64AtomicRmw8UAdd:
  case I64AtomicRmw16UAdd:
  case I64AtomicRmw32UAdd:
  case I32AtomicRmwSub:
  case I64AtomicRmwSub:
  case I32AtomicRmw8USub:
  case I32AtomicRmw16USub:
  case I64AtomicRmw8USub:
  case I64AtomicRmw16USub:
  case I64AtomicRmw32USub:
  case I32AtomicRmwAnd:
  case I64AtomicRmwAnd:
  case I32AtomicRmw8UAnd:
  case I32AtomicRmw16UAnd:
  case I64AtomicRmw8UAnd:
  case I64AtomicRmw16UAnd:
  case I64AtomicRmw32UAnd:
  case I32AtomicRmwOr:
  case I64AtomicRmwOr:
  case I32AtomicRmw8UOr:
  case I32AtomicRmw16UOr:
  case I64AtomicRmw8UOr:
  case I64AtomicRmw16UOr:
  case I64AtomicRmw32UOr:
  case I32AtomicRmwXor:
  case I64AtomicRmwXor:
  case I32AtomicRmw8UXor:
  case I32AtomicRmw16UXor:
  case I64AtomicRmw8UXor:
  case I64AtomicRmw16UXor:
  case I64AtomicRmw32UXor:
  case I32AtomicRmwXchg:
  case I64AtomicRmwXchg:
  case I32AtomicRmw8UXchg:
  case I32AtomicRmw16UXchg:
  case I64AtomicRmw8UXchg:
  case I64AtomicRmw16UXchg:
  case I64AtomicRmw32UXchg:
  case I32AtomicRmwCmpxchg:
  case I64AtomicRmwCmpxchg:
  case I32AtomicRmw8UCmpxchg:
  case I32AtomicRmw16UCmpxchg:
  case I64AtomicRmw8UCmpxchg:
  case I64AtomicRmw16UCmpxchg:
  case I64AtomicRmw32UCmpxchg:
    uVar1 = features->threads_enabled_;
  }
  return (bool)uVar1;
}

Assistant:

bool Opcode::IsEnabled(const Features& features) const {
  switch (enum_) {
    case Opcode::Try:
    case Opcode::Catch:
    case Opcode::Throw:
    case Opcode::Rethrow:
    case Opcode::IfExcept:
      return features.exceptions_enabled();

    case Opcode::ReturnCallIndirect:
    case Opcode::ReturnCall:
      return features.tail_call_enabled();

    case Opcode::I32TruncSSatF32:
    case Opcode::I32TruncUSatF32:
    case Opcode::I32TruncSSatF64:
    case Opcode::I32TruncUSatF64:
    case Opcode::I64TruncSSatF32:
    case Opcode::I64TruncUSatF32:
    case Opcode::I64TruncSSatF64:
    case Opcode::I64TruncUSatF64:
      return features.sat_float_to_int_enabled();

    case Opcode::I32Extend8S:
    case Opcode::I32Extend16S:
    case Opcode::I64Extend8S:
    case Opcode::I64Extend16S:
    case Opcode::I64Extend32S:
      return features.sign_extension_enabled();

    case Opcode::AtomicWake:
    case Opcode::I32AtomicWait:
    case Opcode::I64AtomicWait:
    case Opcode::I32AtomicLoad:
    case Opcode::I64AtomicLoad:
    case Opcode::I32AtomicLoad8U:
    case Opcode::I32AtomicLoad16U:
    case Opcode::I64AtomicLoad8U:
    case Opcode::I64AtomicLoad16U:
    case Opcode::I64AtomicLoad32U:
    case Opcode::I32AtomicStore:
    case Opcode::I64AtomicStore:
    case Opcode::I32AtomicStore8:
    case Opcode::I32AtomicStore16:
    case Opcode::I64AtomicStore8:
    case Opcode::I64AtomicStore16:
    case Opcode::I64AtomicStore32:
    case Opcode::I32AtomicRmwAdd:
    case Opcode::I64AtomicRmwAdd:
    case Opcode::I32AtomicRmw8UAdd:
    case Opcode::I32AtomicRmw16UAdd:
    case Opcode::I64AtomicRmw8UAdd:
    case Opcode::I64AtomicRmw16UAdd:
    case Opcode::I64AtomicRmw32UAdd:
    case Opcode::I32AtomicRmwSub:
    case Opcode::I64AtomicRmwSub:
    case Opcode::I32AtomicRmw8USub:
    case Opcode::I32AtomicRmw16USub:
    case Opcode::I64AtomicRmw8USub:
    case Opcode::I64AtomicRmw16USub:
    case Opcode::I64AtomicRmw32USub:
    case Opcode::I32AtomicRmwAnd:
    case Opcode::I64AtomicRmwAnd:
    case Opcode::I32AtomicRmw8UAnd:
    case Opcode::I32AtomicRmw16UAnd:
    case Opcode::I64AtomicRmw8UAnd:
    case Opcode::I64AtomicRmw16UAnd:
    case Opcode::I64AtomicRmw32UAnd:
    case Opcode::I32AtomicRmwOr:
    case Opcode::I64AtomicRmwOr:
    case Opcode::I32AtomicRmw8UOr:
    case Opcode::I32AtomicRmw16UOr:
    case Opcode::I64AtomicRmw8UOr:
    case Opcode::I64AtomicRmw16UOr:
    case Opcode::I64AtomicRmw32UOr:
    case Opcode::I32AtomicRmwXor:
    case Opcode::I64AtomicRmwXor:
    case Opcode::I32AtomicRmw8UXor:
    case Opcode::I32AtomicRmw16UXor:
    case Opcode::I64AtomicRmw8UXor:
    case Opcode::I64AtomicRmw16UXor:
    case Opcode::I64AtomicRmw32UXor:
    case Opcode::I32AtomicRmwXchg:
    case Opcode::I64AtomicRmwXchg:
    case Opcode::I32AtomicRmw8UXchg:
    case Opcode::I32AtomicRmw16UXchg:
    case Opcode::I64AtomicRmw8UXchg:
    case Opcode::I64AtomicRmw16UXchg:
    case Opcode::I64AtomicRmw32UXchg:
    case Opcode::I32AtomicRmwCmpxchg:
    case Opcode::I64AtomicRmwCmpxchg:
    case Opcode::I32AtomicRmw8UCmpxchg:
    case Opcode::I32AtomicRmw16UCmpxchg:
    case Opcode::I64AtomicRmw8UCmpxchg:
    case Opcode::I64AtomicRmw16UCmpxchg:
    case Opcode::I64AtomicRmw32UCmpxchg:
      return features.threads_enabled();

    case Opcode::V128Const:
    case Opcode::V128Load:
    case Opcode::V128Store:
    case Opcode::I8X16Splat:
    case Opcode::I16X8Splat:
    case Opcode::I32X4Splat:
    case Opcode::I64X2Splat:
    case Opcode::F32X4Splat:
    case Opcode::F64X2Splat:
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::F64X2ExtractLane:
    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::F64X2ReplaceLane:
    case Opcode::V8X16Shuffle:
    case Opcode::I8X16Add:
    case Opcode::I16X8Add:
    case Opcode::I32X4Add:
    case Opcode::I64X2Add:
    case Opcode::I8X16Sub:
    case Opcode::I16X8Sub:
    case Opcode::I32X4Sub:
    case Opcode::I64X2Sub:
    case Opcode::I8X16Mul:
    case Opcode::I16X8Mul:
    case Opcode::I32X4Mul:
    case Opcode::I8X16Neg:
    case Opcode::I16X8Neg:
    case Opcode::I32X4Neg:
    case Opcode::I64X2Neg:
    case Opcode::I8X16AddSaturateS:
    case Opcode::I8X16AddSaturateU:
    case Opcode::I16X8AddSaturateS:
    case Opcode::I16X8AddSaturateU:
    case Opcode::I8X16SubSaturateS:
    case Opcode::I8X16SubSaturateU:
    case Opcode::I16X8SubSaturateS:
    case Opcode::I16X8SubSaturateU:
    case Opcode::I8X16Shl:
    case Opcode::I16X8Shl:
    case Opcode::I32X4Shl:
    case Opcode::I64X2Shl:
    case Opcode::I8X16ShrS:
    case Opcode::I8X16ShrU:
    case Opcode::I16X8ShrS:
    case Opcode::I16X8ShrU:
    case Opcode::I32X4ShrS:
    case Opcode::I32X4ShrU:
    case Opcode::I64X2ShrS:
    case Opcode::I64X2ShrU:
    case Opcode::V128And:
    case Opcode::V128Or:
    case Opcode::V128Xor:
    case Opcode::V128Not:
    case Opcode::V128BitSelect:
    case Opcode::I8X16AnyTrue:
    case Opcode::I16X8AnyTrue:
    case Opcode::I32X4AnyTrue:
    case Opcode::I64X2AnyTrue:
    case Opcode::I8X16AllTrue:
    case Opcode::I16X8AllTrue:
    case Opcode::I32X4AllTrue:
    case Opcode::I64X2AllTrue:
    case Opcode::I8X16Eq:
    case Opcode::I16X8Eq:
    case Opcode::I32X4Eq:
    case Opcode::F32X4Eq:
    case Opcode::F64X2Eq:
    case Opcode::I8X16Ne:
    case Opcode::I16X8Ne:
    case Opcode::I32X4Ne:
    case Opcode::F32X4Ne:
    case Opcode::F64X2Ne:
    case Opcode::I8X16LtS:
    case Opcode::I8X16LtU:
    case Opcode::I16X8LtS:
    case Opcode::I16X8LtU:
    case Opcode::I32X4LtS:
    case Opcode::I32X4LtU:
    case Opcode::F32X4Lt:
    case Opcode::F64X2Lt:
    case Opcode::I8X16LeS:
    case Opcode::I8X16LeU:
    case Opcode::I16X8LeS:
    case Opcode::I16X8LeU:
    case Opcode::I32X4LeS:
    case Opcode::I32X4LeU:
    case Opcode::F32X4Le:
    case Opcode::F64X2Le:
    case Opcode::I8X16GtS:
    case Opcode::I8X16GtU:
    case Opcode::I16X8GtS:
    case Opcode::I16X8GtU:
    case Opcode::I32X4GtS:
    case Opcode::I32X4GtU:
    case Opcode::F32X4Gt:
    case Opcode::F64X2Gt:
    case Opcode::I8X16GeS:
    case Opcode::I8X16GeU:
    case Opcode::I16X8GeS:
    case Opcode::I16X8GeU:
    case Opcode::I32X4GeS:
    case Opcode::I32X4GeU:
    case Opcode::F32X4Ge:
    case Opcode::F64X2Ge:
    case Opcode::F32X4Neg:
    case Opcode::F64X2Neg:
    case Opcode::F32X4Abs:
    case Opcode::F64X2Abs:
    case Opcode::F32X4Min:
    case Opcode::F64X2Min:
    case Opcode::F32X4Max:
    case Opcode::F64X2Max:
    case Opcode::F32X4Add:
    case Opcode::F64X2Add:
    case Opcode::F32X4Sub:
    case Opcode::F64X2Sub:
    case Opcode::F32X4Div:
    case Opcode::F64X2Div:
    case Opcode::F32X4Mul:
    case Opcode::F64X2Mul:
    case Opcode::F32X4Sqrt:
    case Opcode::F64X2Sqrt:
    case Opcode::F32X4ConvertSI32X4:
    case Opcode::F32X4ConvertUI32X4:
    case Opcode::F64X2ConvertSI64X2:
    case Opcode::F64X2ConvertUI64X2:
    case Opcode::I32X4TruncSF32X4Sat:
    case Opcode::I32X4TruncUF32X4Sat:
    case Opcode::I64X2TruncSF64X2Sat:
    case Opcode::I64X2TruncUF64X2Sat:
      return features.simd_enabled();

    case Opcode::MemoryInit:
    case Opcode::MemoryDrop:
    case Opcode::MemoryCopy:
    case Opcode::MemoryFill:
    case Opcode::TableInit:
    case Opcode::TableDrop:
    case Opcode::TableCopy:
      return features.bulk_memory_enabled();

    // Interpreter opcodes are never "enabled".
    case Opcode::InterpAlloca:
    case Opcode::InterpBrUnless:
    case Opcode::InterpCallHost:
    case Opcode::InterpData:
    case Opcode::InterpDropKeep:
      return false;

    default:
      return true;
  }
}